

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

void ndiLogState(ndicapi *pol,char *outInformation)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  char (*pacVar4) [32];
  char (*pacVar5) [20];
  char (*pacVar6) [2];
  char (*pacVar7) [52];
  char (*pacVar8) [8];
  char (*pacVar9) [12];
  char (*pacVar10) [24];
  char (*pacVar11) [11];
  char (*pacVar12) [3];
  int j;
  int i_26;
  int i;
  long lVar13;
  stringstream ss;
  char *local_1f8;
  ulong local_1f0;
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  string local_50 [8];
  size_t local_48;
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  pacVar7 = pol->GxTransforms;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"GxTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][52]: ");
    poVar1 = std::operator<<(poVar1,*pacVar7);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar7 = pacVar7 + 1;
  }
  poVar1 = std::operator<<(local_1c8,"GxStatus[8]: ");
  std::operator<<(poVar1,pol->GxStatus);
  pacVar9 = pol->GxInformation;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"GxInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][12]: ");
    poVar1 = std::operator<<(poVar1,*pacVar9);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar9 = pacVar9 + 1;
  }
  pacVar10 = pol->GxSingleStray;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"GxSingleStray[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][24]: ");
    poVar1 = std::operator<<(poVar1,*pacVar10);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar10 = pacVar10 + 1;
  }
  pacVar8 = pol->GxFrame;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"GxFrame[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,*pacVar8);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar8 = pacVar8 + 1;
  }
  pacVar7 = pol->GxPassiveTransforms;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"GxPassiveTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][52]: ");
    poVar1 = std::operator<<(poVar1,*pacVar7);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar7 = pacVar7 + 1;
  }
  poVar1 = std::operator<<(local_1c8,"GxPassiveStatus[24]: ");
  std::operator<<(poVar1,pol->GxPassiveStatus);
  pacVar9 = pol->GxPassiveInformation;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"GxPassiveInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][12]: ");
    poVar1 = std::operator<<(poVar1,*pacVar9);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar9 = pacVar9 + 1;
  }
  pacVar8 = pol->GxPassiveFrame;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"GxPassiveFrame[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,*pacVar8);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar8 = pacVar8 + 1;
  }
  poVar1 = std::operator<<(local_1c8,"GxPassiveStray[424]: ");
  std::operator<<(poVar1,pol->GxPassiveStray);
  pacVar4 = pol->PstatBasic;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatBasic[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][32]: ");
    poVar1 = std::operator<<(poVar1,*pacVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar4 = pacVar4 + 1;
  }
  pacVar8 = pol->PstatTesting;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatTesting[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,*pacVar8);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar8 = pacVar8 + 1;
  }
  pacVar5 = pol->PstatPartNumber;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatPartNumber[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][20]: ");
    poVar1 = std::operator<<(poVar1,*pacVar5);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar5 = pacVar5 + 1;
  }
  pacVar6 = pol->PstatAccessories;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatAccessories[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,*pacVar6);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar6 = pacVar6 + 1;
  }
  pacVar6 = pol->PstatMarkerType;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatMarkerType[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,*pacVar6);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar6 = pacVar6 + 1;
  }
  pacVar4 = pol->PstatPassiveBasic;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatPassiveBasic[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][32]: ");
    poVar1 = std::operator<<(poVar1,*pacVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar4 = pacVar4 + 1;
  }
  pacVar8 = pol->PstatPassiveTesting;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatPassiveTesting[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,*pacVar8);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar8 = pacVar8 + 1;
  }
  pacVar5 = pol->PstatPassivePartNumber;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatPassivePartNumber[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][20]: ");
    poVar1 = std::operator<<(poVar1,*pacVar5);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar5 = pacVar5 + 1;
  }
  pacVar6 = pol->PstatPassiveAccessories;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatPassiveAccessories[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,*pacVar6);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar6 = pacVar6 + 1;
  }
  pacVar6 = pol->PstatPassiveMarkerType;
  for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"PstatPassiveMarkerType[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][2]: ");
    poVar1 = std::operator<<(poVar1,*pacVar6);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar6 = pacVar6 + 1;
  }
  poVar1 = std::operator<<(local_1c8,"SstatControl[2]: ");
  poVar1 = std::operator<<(poVar1,pol->SstatControl);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"SstatSensor[2]: ");
  poVar1 = std::operator<<(poVar1,pol->SstatSensor);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"SstatTiu[2]: ");
  poVar1 = std::operator<<(poVar1,pol->SstatTiu);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"IrchkDetected: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pol->IrchkDetected);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"IrchkSources[128]: ");
  poVar1 = std::operator<<(poVar1,pol->IrchkSources);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhrqReply[2]: ");
  poVar1 = std::operator<<(poVar1,pol->PhrqReply);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhsrReply[1284]: ");
  poVar1 = std::operator<<(poVar1,pol->PhsrReply);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfUnoccupied: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pol->PhinfUnoccupied);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfBasic[34]: ");
  poVar1 = std::operator<<(poVar1,pol->PhinfBasic);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfTesting[8]: ");
  poVar1 = std::operator<<(poVar1,pol->PhinfTesting);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfPartNumber[20]: ");
  poVar1 = std::operator<<(poVar1,pol->PhinfPartNumber);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfAccessories[2]: ");
  poVar1 = std::operator<<(poVar1,pol->PhinfAccessories);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfMarkerType[2]: ");
  poVar1 = std::operator<<(poVar1,pol->PhinfMarkerType);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfPortLocation[14]: ");
  poVar1 = std::operator<<(poVar1,pol->PhinfPortLocation);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"PhinfGpioStatus[2]: ");
  poVar1 = std::operator<<(poVar1,pol->PhinfGpioStatus);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"TxHandleCount: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pol->TxHandleCount);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"TxHandles[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,(char *)pol->TxHandles);
  std::endl<char,std::char_traits<char>>(poVar1);
  pacVar7 = pol->TxTransforms;
  for (lVar13 = 0; uVar2 = (ulong)pol->TxHandleCount, lVar13 < (long)uVar2; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"TxTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][52]: ");
    poVar1 = std::operator<<(poVar1,*pacVar7);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar7 = pacVar7 + 1;
  }
  pacVar8 = pol->TxStatus;
  for (lVar13 = 0; lVar13 < (int)uVar2; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"TxStatus[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,*pacVar8);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar2 = (ulong)(uint)pol->TxHandleCount;
    pacVar8 = pacVar8 + 1;
  }
  pacVar8 = pol->TxFrame;
  for (lVar13 = 0; lVar13 < (int)uVar2; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"TxFrame[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::operator<<(poVar1,*pacVar8);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar2 = (ulong)(uint)pol->TxHandleCount;
    pacVar8 = pacVar8 + 1;
  }
  pacVar9 = pol->TxInformation;
  for (lVar13 = 0; lVar13 < (int)uVar2; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"TxInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][12]: ");
    poVar1 = std::operator<<(poVar1,*pacVar9);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar2 = (ulong)(uint)pol->TxHandleCount;
    pacVar9 = pacVar9 + 1;
  }
  pacVar10 = pol->TxSingleStray;
  for (lVar13 = 0; lVar13 < (int)uVar2; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"TxSingleStray[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][24]: ");
    poVar1 = std::operator<<(poVar1,*pacVar10);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar2 = (ulong)(uint)pol->TxHandleCount;
    pacVar10 = pacVar10 + 1;
  }
  poVar1 = std::operator<<(local_1c8,"TxSystemStatus[4]: ");
  poVar1 = std::operator<<(poVar1,pol->TxSystemStatus);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"TxPassiveStrayCount: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pol->TxPassiveStrayCount);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"TxPassiveStrayOov[14]: ");
  poVar1 = std::operator<<(poVar1,pol->TxPassiveStrayOov);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"TxPassiveStray[1052]: ");
  poVar1 = std::operator<<(poVar1,pol->TxPassiveStray);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"BxHandleCount: ");
  poVar1 = std::operator<<(poVar1,pol->BxHandleCount);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"BxHandles[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,pol->BxHandles);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"BxHandlesStatus[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,pol->BxHandlesStatus);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"BxFrameNumber[NDI_MAX_HANDLES]: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar2 = 0; uVar2 < pol->BxHandleCount; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(local_1c8,"BxTransforms[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar2);
    poVar1 = std::operator<<(poVar1,"][8]: ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<(local_1c8,"BxPortStatus[NDI_MAX_HANDLES]: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  pacVar11 = pol->BxToolMarkerInformation;
  for (uVar2 = 0; uVar2 < pol->BxHandleCount; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(local_1c8,"BxToolMarkerInformation[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar2);
    poVar1 = std::operator<<(poVar1,"][11]: ");
    poVar1 = std::operator<<(poVar1,*pacVar11);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar11 = pacVar11 + 1;
  }
  poVar1 = std::operator<<(local_1c8,"BxActiveSingleStrayMarkerStatus[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,pol->BxActiveSingleStrayMarkerStatus);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar2 = 0; uVar2 < pol->BxHandleCount; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(local_1c8,"BxActiveSingleStrayMarkerPosition[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar2);
    poVar1 = std::operator<<(poVar1,"][3]: ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<(local_1c8,"Bx3DMarkerCount[NDI_MAX_HANDLES]: ");
  poVar1 = std::operator<<(poVar1,pol->Bx3DMarkerCount);
  std::endl<char,std::char_traits<char>>(poVar1);
  pacVar12 = pol->Bx3DMarkerOutOfVolume;
  for (uVar2 = 0; uVar3 = (ulong)pol->BxHandleCount, uVar2 < uVar3; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(local_1c8,"Bx3DMarkerOutOfVolume[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar2);
    poVar1 = std::operator<<(poVar1,"][3]: ");
    poVar1 = std::operator<<(poVar1,*pacVar12);
    std::endl<char,std::char_traits<char>>(poVar1);
    pacVar12 = pacVar12 + 1;
  }
  for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
    for (lVar13 = 0; lVar13 < pol->Bx3DMarkerCount[uVar2]; lVar13 = lVar13 + 1) {
      poVar1 = std::operator<<(local_1c8,"Bx3DMarkerPosition[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar2);
      poVar1 = std::operator<<(poVar1,"][");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
      poVar1 = std::operator<<(poVar1,"][3]: ");
      poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    uVar3 = (ulong)pol->BxHandleCount;
  }
  poVar1 = std::operator<<(local_1c8,"BxPassiveStrayCount: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pol->BxPassiveStrayCount);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1c8,"BxPassiveStrayOutOfVolume[30]: ");
  poVar1 = std::operator<<(poVar1,pol->BxPassiveStrayOutOfVolume);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar13 = 0; lVar13 < pol->BxPassiveStrayCount; lVar13 = lVar13 + 1) {
    poVar1 = std::operator<<(local_1c8,"BxPassiveStrayPosition[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar13);
    poVar1 = std::operator<<(poVar1,"][3]: ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::stringbuf::str();
  if (local_1f0 < 0xffff) {
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    strncpy(outInformation,local_1f8,local_48);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream(local_1d8);
    return;
  }
  __assert_fail("ss.str().size() < USHRT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/qiaotian[P]ndicapi/ndicapi.cxx"
                ,0xef,"void ndiLogState(ndicapi *, char *)");
}

Assistant:

ndicapiExport void ndiLogState(ndicapi* pol, char outInformation[USHRT_MAX])
{
#ifdef __cplusplus
  std::stringstream ss;
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxTransforms[" << i << "][52]: " << pol->GxTransforms[i] << std::endl;
  }
  ss << "GxStatus[8]: " << pol->GxStatus;
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxInformation[" << i << "][12]: " << pol->GxInformation[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxSingleStray[" << i << "][24]: " << pol->GxSingleStray[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "GxFrame[" << i << "][8]: " << pol->GxFrame[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveTransforms[" << i << "][52]: " << pol->GxPassiveTransforms[i] << std::endl;
  }
  ss << "GxPassiveStatus[24]: " << pol->GxPassiveStatus;
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveInformation[" << i << "][12]: " << pol->GxPassiveInformation[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "GxPassiveFrame[" << i << "][8]: " << pol->GxPassiveFrame[i] << std::endl;
  }
  ss << "GxPassiveStray[424]: " << pol->GxPassiveStray;
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatBasic[" << i << "][32]: " << pol->PstatBasic[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatTesting[" << i << "][8]: " << pol->PstatTesting[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatPartNumber[" << i << "][20]: " << pol->PstatPartNumber[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatAccessories[" << i << "][2]: " << pol->PstatAccessories[i] << std::endl;
  }
  for (int i = 0; i < 3; ++i)
  {
    ss << "PstatMarkerType[" << i << "][2]: " << pol->PstatMarkerType[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveBasic[" << i << "][32]: " << pol->PstatPassiveBasic[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveTesting[" << i << "][8]: " << pol->PstatPassiveTesting[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassivePartNumber[" << i << "][20]: " << pol->PstatPassivePartNumber[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveAccessories[" << i << "][2]: " << pol->PstatPassiveAccessories[i] << std::endl;
  }
  for (int i = 0; i < 9; ++i)
  {
    ss << "PstatPassiveMarkerType[" << i << "][2]: " << pol->PstatPassiveMarkerType[i] << std::endl;
  }
  ss << "SstatControl[2]: " << pol->SstatControl << std::endl;
  ss << "SstatSensor[2]: " << pol->SstatSensor << std::endl;
  ss << "SstatTiu[2]: " << pol->SstatTiu << std::endl;
  ss << "IrchkDetected: " << pol->IrchkDetected << std::endl;
  ss << "IrchkSources[128]: " << pol->IrchkSources << std::endl;
  ss << "PhrqReply[2]: " << pol->PhrqReply << std::endl;
  ss << "PhsrReply[1284]: " << pol->PhsrReply << std::endl;
  ss << "PhinfUnoccupied: " << pol->PhinfUnoccupied << std::endl;
  ss << "PhinfBasic[34]: " << pol->PhinfBasic << std::endl;
  ss << "PhinfTesting[8]: " << pol->PhinfTesting << std::endl;
  ss << "PhinfPartNumber[20]: " << pol->PhinfPartNumber << std::endl;
  ss << "PhinfAccessories[2]: " << pol->PhinfAccessories << std::endl;
  ss << "PhinfMarkerType[2]: " << pol->PhinfMarkerType << std::endl;
  ss << "PhinfPortLocation[14]: " << pol->PhinfPortLocation << std::endl;
  ss << "PhinfGpioStatus[2]: " << pol->PhinfGpioStatus << std::endl;
  ss << "TxHandleCount: " << pol->TxHandleCount << std::endl;
  ss << "TxHandles[NDI_MAX_HANDLES]: " << pol->TxHandles << std::endl;
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxTransforms[" << i << "][52]: " << pol->TxTransforms[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxStatus[" << i << "][8]: " << pol->TxStatus[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxFrame[" << i << "][8]: " << pol->TxFrame[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxInformation[" << i << "][12]: " << pol->TxInformation[i] << std::endl;
  }
  for (int i = 0; i < pol->TxHandleCount; ++i)
  {
    ss << "TxSingleStray[" << i << "][24]: " << pol->TxSingleStray[i] << std::endl;
  }
  ss << "TxSystemStatus[4]: " << pol->TxSystemStatus << std::endl;
  ss << "TxPassiveStrayCount: " << pol->TxPassiveStrayCount << std::endl;
  ss << "TxPassiveStrayOov[14]: " << pol->TxPassiveStrayOov << std::endl;
  ss << "TxPassiveStray[1052]: " << pol->TxPassiveStray << std::endl;
  ss << "BxHandleCount: " << pol->BxHandleCount << std::endl;
  ss << "BxHandles[NDI_MAX_HANDLES]: " << pol->BxHandles << std::endl;
  ss << "BxHandlesStatus[NDI_MAX_HANDLES]: " << pol->BxHandlesStatus << std::endl;
  ss << "BxFrameNumber[NDI_MAX_HANDLES]: " << pol->BxFrameNumber << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxTransforms[" << i << "][8]: " << pol->BxTransforms[i] << std::endl;
  }
  ss << "BxPortStatus[NDI_MAX_HANDLES]: " << pol->BxPortStatus << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxToolMarkerInformation[" << i << "][11]: " << pol->BxToolMarkerInformation[i] << std::endl;
  }
  ss << "BxActiveSingleStrayMarkerStatus[NDI_MAX_HANDLES]: " << pol->BxActiveSingleStrayMarkerStatus << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "BxActiveSingleStrayMarkerPosition[" << i << "][3]: " << pol->BxActiveSingleStrayMarkerPosition[i] << std::endl;
  }
  ss << "Bx3DMarkerCount[NDI_MAX_HANDLES]: " << pol->Bx3DMarkerCount << std::endl;
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    ss << "Bx3DMarkerOutOfVolume[" << i << "][3]: " << pol->Bx3DMarkerOutOfVolume[i] << std::endl;
  }
  for (int i = 0; i < pol->BxHandleCount; ++i)
  {
    for (int j = 0; j < pol->Bx3DMarkerCount[i]; j++)
    {
      ss << "Bx3DMarkerPosition[" << i << "][" << j << "][3]: " << pol->Bx3DMarkerPosition[i][j] << std::endl;
    }
  }
  ss << "BxPassiveStrayCount: " << pol->BxPassiveStrayCount << std::endl;
  ss << "BxPassiveStrayOutOfVolume[30]: " << pol->BxPassiveStrayOutOfVolume << std::endl;
  for (int i = 0; i < pol->BxPassiveStrayCount; ++i)
  {
    ss << "BxPassiveStrayPosition[" << i << "][3]: " << pol->BxPassiveStrayPosition[i] << std::endl;
  }

  assert(ss.str().size() < USHRT_MAX);
  strncpy(&outInformation[0], ss.str().c_str(), ss.str().size());
#else
  // Someone else can implement c style string building
#endif
}